

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpruned_grid.hpp
# Opt level: O3

spherical_grid_ptr __thiscall
IntegratorXX::detail::generate_unpruned_grid_impl<IntegratorXX::Womersley<double>>
          (detail *this,RadialQuad rq,RadialTraits *traits,Womersley<double> *ang_quad)

{
  BeckeRadialTraits *args;
  MuraKnowlesRadialTraits *args_00;
  TreutlerAhlrichsRadialTraits *args_01;
  MurrayHandyLamingRadialTraits<2UL> *args_02;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  spherical_grid_ptr sVar2;
  undefined1 local_59;
  SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
  *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  void *local_48 [2];
  long local_38;
  void *local_30;
  long local_20;
  
  switch(rq << 0x1c | rq - Becke >> 4) {
  case 0:
    args = radial_traits_cast<IntegratorXX::BeckeRadialTraits>(traits);
    Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>>
    ::Quadrature<IntegratorXX::BeckeRadialTraits_const&,void>
              ((Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>>
                *)local_48,args);
    local_58 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
                *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Womersley<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Womersley<double>>>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::Womersley<double>>
              (&_Stack_50,&local_58,
               (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>_>
                *)&local_59,
               (RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>
                *)local_48,ang_quad);
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    args_02 = radial_traits_cast<IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>(traits);
    Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>
    ::Quadrature<IntegratorXX::MurrayHandyLamingRadialTraits<2ul>const&,void>
              ((Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>
                *)local_48,args_02);
    local_58 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
                *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::Womersley<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::Womersley<double>>>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::Womersley<double>>
              (&_Stack_50,
               (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_IntegratorXX::Womersley<double>_>
                **)&local_58,
               (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_IntegratorXX::Womersley<double>_>_>
                *)&local_59,
               (RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>
                *)local_48,ang_quad);
    _Var1._M_pi = extraout_RDX_02;
    break;
  case 2:
    args_00 = radial_traits_cast<IntegratorXX::MuraKnowlesRadialTraits>(traits);
    Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>
    ::Quadrature<IntegratorXX::MuraKnowlesRadialTraits_const&,void>
              ((Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>
                *)local_48,args_00);
    local_58 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
                *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::Womersley<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::Womersley<double>>>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::Womersley<double>>
              (&_Stack_50,
               (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>
                **)&local_58,
               (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>_>
                *)&local_59,
               (RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>
                *)local_48,ang_quad);
    _Var1._M_pi = extraout_RDX_00;
    break;
  case 3:
    args_01 = radial_traits_cast<IntegratorXX::TreutlerAhlrichsRadialTraits>(traits);
    Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
    ::Quadrature<IntegratorXX::TreutlerAhlrichsRadialTraits_const&,void>
              ((Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>
                *)local_48,args_01);
    local_58 = (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
                *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>,std::allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>>,IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Womersley<double>>
              (&_Stack_50,
               (SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>
                **)&local_58,
               (allocator<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Womersley<double>_>_>
                *)&local_59,
               (RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>
                *)local_48,ang_quad);
    _Var1._M_pi = extraout_RDX_01;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unsupported Radial Quadrature");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_IntegratorXX::Womersley<double>_>
    **)this = local_58;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_50._M_pi;
  if (local_30 != (void *)0x0) {
    operator_delete(local_30,local_20 - (long)local_30);
    _Var1._M_pi = extraout_RDX_03;
  }
  if (local_48[0] != (void *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
    _Var1._M_pi = extraout_RDX_04;
  }
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (spherical_grid_ptr)
         sVar2.
         super___shared_ptr<IntegratorXX::SphericalQuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

auto generate_unpruned_grid_impl(RadialQuad rq, const RadialTraits& traits,
  AngularQuadType&& ang_quad) {

  switch( rq ) {

    case RadialQuad::Becke:
      return SphericalGridFactory::generate_unpruned_grid( bk_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::MuraKnowles:
      return SphericalGridFactory::generate_unpruned_grid( mk_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::MurrayHandyLaming:
      return SphericalGridFactory::generate_unpruned_grid( mhl_type(traits), std::forward<AngularQuadType>(ang_quad) );

    case RadialQuad::TreutlerAhlrichs:
      return SphericalGridFactory::generate_unpruned_grid( ta_type(traits), std::forward<AngularQuadType>(ang_quad) );

    default:
      throw std::runtime_error("Unsupported Radial Quadrature");
      abort();

  }

}